

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

size_t SSL_quic_max_handshake_flight_len(SSL *ssl,ssl_encryption_level_t level)

{
  uint uVar1;
  
  uVar1 = 0x4000;
  switch(level) {
  case ssl_encryption_initial:
  case ssl_encryption_application:
    break;
  default:
    uVar1 = 0;
    break;
  case ssl_encryption_handshake:
    if ((ssl->field_0xa4 & 1) == 0) {
      uVar1 = ssl->max_cert_list * 2;
LAB_001531c8:
      if (0x4000 < uVar1) break;
    }
    else if ((((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->verify_mode & 1) != 0
            ) {
      uVar1 = ssl->max_cert_list;
      goto LAB_001531c8;
    }
    uVar1 = 0x4000;
  }
  return (ulong)uVar1;
}

Assistant:

size_t SSL_quic_max_handshake_flight_len(const SSL *ssl,
                                         enum ssl_encryption_level_t level) {
  // Limits flights to 16K by default when there are no large
  // (certificate-carrying) messages.
  static const size_t kDefaultLimit = 16384;

  switch (level) {
    case ssl_encryption_initial:
      return kDefaultLimit;
    case ssl_encryption_early_data:
      // QUIC does not send EndOfEarlyData.
      return 0;
    case ssl_encryption_handshake:
      if (ssl->server) {
        // Servers may receive Certificate message if configured to request
        // client certificates.
        if (!!(ssl->config->verify_mode & SSL_VERIFY_PEER) &&
            ssl->max_cert_list > kDefaultLimit) {
          return ssl->max_cert_list;
        }
      } else {
        // Clients may receive both Certificate message and a CertificateRequest
        // message.
        if (2 * ssl->max_cert_list > kDefaultLimit) {
          return 2 * ssl->max_cert_list;
        }
      }
      return kDefaultLimit;
    case ssl_encryption_application:
      // Note there is not actually a bound on the number of NewSessionTickets
      // one may send in a row. This level may need more involved flow
      // control. See https://github.com/quicwg/base-drafts/issues/1834.
      return kDefaultLimit;
  }

  return 0;
}